

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

Ptr __thiscall core::image::load_jpg_file(image *this,string *filename,string *exif)

{
  byte *pbVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  FileException *this_01;
  int *piVar7;
  char *pcVar8;
  Exception *pEVar9;
  char *data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Image<unsigned_char> *__tmp;
  Ptr PVar10;
  code *local_3a0;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  string local_58;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    this_01 = (FileException *)__cxa_allocate_exception(0x48);
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    util::FileException::FileException(this_01,filename,pcVar8);
    __cxa_throw(this_01,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  jerr._160_8_ = jpeg_std_error(&local_3a0);
  local_3a0 = jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  jpeg_stdio_src(&jerr.first_addon_message,__stream);
  if (exif != (string *)0x0) {
    jpeg_save_markers(&jerr.first_addon_message,0xe1,0xffff);
  }
  iVar5 = jpeg_read_header(&jerr.first_addon_message,0);
  if (iVar5 != 1) {
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"JPEG header not recognized","");
    util::Exception::Exception(pEVar9,&local_58);
    __cxa_throw(pEVar9,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  if ((((exif != (string *)0x0) && (cinfo._392_8_ != 0)) && (*(char *)(cinfo._392_8_ + 8) == -0x1f))
     && ((6 < *(uint *)(cinfo._392_8_ + 0x10) &&
         (pcVar8 = *(char **)(cinfo._392_8_ + 0x18), *pcVar8 == 'E')))) {
    lVar6 = 1;
    do {
      if (lVar6 == 6) {
        std::__cxx11::string::replace((ulong)exif,exif->_M_string_length,(char *)0x0,(ulong)pcVar8);
        break;
      }
      pbVar1 = (byte *)(pcVar8 + lVar6);
      pcVar2 = "Exif" + lVar6;
      lVar6 = lVar6 + 1;
    } while ((uint)*pbVar1 == (int)*pcVar2);
  }
  if (cinfo.num_components - 3U < 0xfffffffe) {
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Invalid JPEG color space","");
    util::Exception::Exception(pEVar9,&local_58);
    __cxa_throw(pEVar9,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  local_58._M_dataplus._M_p = (pointer)operator_new(0x30);
  iVar5 = (uint)(cinfo.num_components == 2) * 2 + 1;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.w = 0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.h = 0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.c = 0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase._vptr_ImageBase = (_func_int **)&PTR__TypedImageBase_00124d48;
  if ((((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.w = (int)cinfo.src;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.h = cinfo.src._4_4_;
  (((Image<unsigned_char> *)local_58._M_dataplus._M_p)->super_TypedImageBase<unsigned_char>).
  super_ImageBase.c = iVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(((Image<unsigned_char> *)local_58._M_dataplus._M_p)->
              super_TypedImageBase<unsigned_char>).data,
             (long)((int)cinfo.src * iVar5 * cinfo.src._4_4_));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
             (Image<unsigned_char> *)local_58._M_dataplus._M_p);
  sVar4 = local_58._M_string_length;
  _Var3._M_p = local_58._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  *(pointer *)this = _Var3._M_p;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(size_type *)(this + 8) = sVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  jpeg_start_decompress(&jerr.first_addon_message);
  local_58._M_dataplus._M_p =
       (pointer)(((ImageData *)(_Var3._M_p + 0x18))->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant) {
    do {
      jpeg_read_scanlines(&jerr.first_addon_message,&local_58,1);
      local_58._M_dataplus._M_p =
           local_58._M_dataplus._M_p + (uint)(cinfo.enable_external_quant * iVar5);
    } while ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant);
  }
  jpeg_finish_decompress(&jerr.first_addon_message);
  jpeg_destroy_decompress(&jerr.first_addon_message);
  fclose(__stream);
  PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
load_jpg_file (std::string const& filename, std::string* exif)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ByteImage::Ptr image;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        if (exif)
        {
            /* Request APP1 marker to be saved (this is the EXIF data). */
            jpeg_save_markers(&cinfo, JPEG_APP0 + 1, 0xffff);
        }

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        /* Examine JPEG markers. */
        if (exif)
        {
            jpeg_saved_marker_ptr marker = cinfo.marker_list;
            if (marker != nullptr && marker->marker == JPEG_APP0 + 1
                && marker->data_length > 6
                && std::equal(marker->data, marker->data + 6, "Exif\0\0"))
            {
                char const* data = reinterpret_cast<char const*>(marker->data);
                exif->append(data, data + marker->data_length);
            }
        }

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        /* Create image. */
        int const width = cinfo.image_width;
        int const height = cinfo.image_height;
        int const channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        image = ByteImage::create(width, height, channels);
        ByteImage::ImageData& data = image->get_data();

        /* Start decompression. */
        jpeg_start_decompress(&cinfo);

        unsigned char* data_ptr = &data[0];
        while (cinfo.output_scanline < cinfo.output_height)
        {
            jpeg_read_scanlines(&cinfo, &data_ptr, 1);
            data_ptr += channels * cinfo.output_width;
        }

        /* Shutdown JPEG decompression. */
        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return image;
}